

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall cmTarget::IsXCTestOnApple(cmTarget *this)

{
  bool bVar1;
  char *val;
  string local_30;
  
  bVar1 = IsCFBundleOnApple(this);
  if (bVar1) {
    local_30.field_2._M_allocated_capacity._0_4_ = 0x45544358;
    local_30.field_2._M_allocated_capacity._4_2_ = 0x5453;
    local_30._M_string_length = 6;
    local_30.field_2._M_local_buf[6] = '\0';
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    val = GetProperty(this,&local_30,this->Makefile);
    bVar1 = cmSystemTools::IsOn(val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT17(local_30.field_2._M_local_buf[7],
                               CONCAT16(local_30.field_2._M_local_buf[6],
                                        CONCAT24(local_30.field_2._M_allocated_capacity._4_2_,
                                                 local_30.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmTarget::IsXCTestOnApple() const
{
  return (this->IsCFBundleOnApple() &&
          this->GetPropertyAsBool("XCTEST"));
}